

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

int ChickenHook::vaListToString(char *CFormatString,__va_list_tag *argptr,string *result)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  va_list argcopy;
  void **local_48;
  void *pvStack_40;
  void *local_38 [2];
  
  local_38[0] = argptr->reg_save_area;
  local_48 = *(void ***)argptr;
  pvStack_40 = argptr->overflow_arg_area;
  iVar1 = vsnprintf((char *)0x0,0,CFormatString,&local_48);
  if (-1 < iVar1) {
    __s = (char *)operator_new__((ulong)(iVar1 + 1));
    iVar1 = vsnprintf(__s,(ulong)(iVar1 + 1),CFormatString,argptr);
    local_48 = local_38;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar2);
    std::__cxx11::string::operator=((string *)result,(string *)&local_48);
    if (local_48 != local_38) {
      operator_delete(local_48,(long)local_38[0] + 1);
    }
    operator_delete__(__s);
  }
  return iVar1;
}

Assistant:

int vaListToString(const char *CFormatString, va_list argptr, std::string &result) {
        // calculate the required buffer length of without actually writing
        int len = _vscprintf(CFormatString, argptr);
        if (len < 0) {
            return len;
        }

        // write into an allocated buffer (add 1 for null termination) and create a string from that result
        char *buffer = new char[len + 1];
        len = vsnprintf(buffer, len + 1, CFormatString, argptr);
        result = std::string(buffer);
        delete[] buffer;
        return len;
    }